

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes
          (BorderAmounts_EdgeSizes *this,BorderAmounts_EdgeSizes *from)

{
  BorderAmounts_EdgeSizes *from_local;
  BorderAmounts_EdgeSizes *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BorderAmounts_EdgeSizes_006f37d0
  ;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->startedgesize_,&from->startedgesize_,0x10);
  return;
}

Assistant:

BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes(const BorderAmounts_EdgeSizes& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&startedgesize_, &from.startedgesize_,
    static_cast<size_t>(reinterpret_cast<char*>(&endedgesize_) -
    reinterpret_cast<char*>(&startedgesize_)) + sizeof(endedgesize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BorderAmounts.EdgeSizes)
}